

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QMovableArrayOps<QSslError>::emplace<QSslError_const&>
          (QMovableArrayOps<QSslError> *this,qsizetype i,QSslError *args)

{
  QSslError **ppQVar1;
  qsizetype *pqVar2;
  Data *pDVar3;
  long lVar4;
  long in_FS_OFFSET;
  bool bVar5;
  QSslError tmp;
  Inserter local_58;
  undefined1 *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = (this->super_QGenericArrayOps<QSslError>).super_QArrayDataPointer<QSslError>.d;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (__int_type)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>)) {
LAB_00122ca2:
    local_30 = &DAT_aaaaaaaaaaaaaaaa;
    QSslError::QSslError((QSslError *)&local_30,args);
    bVar5 = (this->super_QGenericArrayOps<QSslError>).super_QArrayDataPointer<QSslError>.size != 0;
    QArrayDataPointer<QSslError>::detachAndGrow
              ((QArrayDataPointer<QSslError> *)this,(uint)(i == 0 && bVar5),1,(QSslError **)0x0,
               (QArrayDataPointer<QSslError> *)0x0);
    if (i == 0 && bVar5) {
      QSslError::QSslError
                ((this->super_QGenericArrayOps<QSslError>).super_QArrayDataPointer<QSslError>.ptr +
                 -8,(QSslError *)&local_30);
      ppQVar1 = &(this->super_QGenericArrayOps<QSslError>).super_QArrayDataPointer<QSslError>.ptr;
      *ppQVar1 = *ppQVar1 + -8;
      pqVar2 = &(this->super_QGenericArrayOps<QSslError>).super_QArrayDataPointer<QSslError>.size;
      *pqVar2 = *pqVar2 + 1;
    }
    else {
      local_58.displaceTo =
           (this->super_QGenericArrayOps<QSslError>).super_QArrayDataPointer<QSslError>.ptr;
      local_58.displaceFrom = local_58.displaceTo + i * 8;
      local_58.displaceTo = local_58.displaceTo + i * 8 + 8;
      local_58.nInserts = 1;
      local_58.bytes =
           ((this->super_QGenericArrayOps<QSslError>).super_QArrayDataPointer<QSslError>.size - i) *
           8;
      local_58.data = (QArrayDataPointer<QSslError> *)this;
      memmove(local_58.displaceTo,local_58.displaceFrom,local_58.bytes);
      QSslError::QSslError(local_58.displaceFrom,(QSslError *)&local_30);
      local_58.displaceFrom = local_58.displaceFrom + 8;
      Inserter::~Inserter(&local_58);
    }
    QSslError::~QSslError((QSslError *)&local_30);
  }
  else {
    lVar4 = (this->super_QGenericArrayOps<QSslError>).super_QArrayDataPointer<QSslError>.size;
    if ((lVar4 == i && pDVar3 != (Data *)0x0) &&
       ((pDVar3->super_QArrayData).alloc !=
        ((long)((long)(this->super_QGenericArrayOps<QSslError>).super_QArrayDataPointer<QSslError>.
                      ptr -
               ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 3) +
        lVar4)) {
      QSslError::QSslError
                ((this->super_QGenericArrayOps<QSslError>).super_QArrayDataPointer<QSslError>.ptr +
                 lVar4 * 8,args);
    }
    else {
      if (((i != 0) || (pDVar3 == (Data *)0x0)) ||
         ((QSslError *)((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)
          == (this->super_QGenericArrayOps<QSslError>).super_QArrayDataPointer<QSslError>.ptr))
      goto LAB_00122ca2;
      QSslError::QSslError
                ((this->super_QGenericArrayOps<QSslError>).super_QArrayDataPointer<QSslError>.ptr +
                 -8,args);
      ppQVar1 = &(this->super_QGenericArrayOps<QSslError>).super_QArrayDataPointer<QSslError>.ptr;
      *ppQVar1 = *ppQVar1 + -8;
    }
    pqVar2 = &(this->super_QGenericArrayOps<QSslError>).super_QArrayDataPointer<QSslError>.size;
    *pqVar2 = *pqVar2 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }